

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:499:69),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:499:69),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  HttpResponseTestCase *pHVar1;
  AsyncIoStream *pAVar2;
  undefined8 uVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOr<kj::Promise<void>_> local_5c0;
  Exception local_448;
  ExceptionOrValue local_2f0;
  char local_190;
  Exception local_188;
  
  local_2f0.exception.ptr.isSet = false;
  local_190 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_2f0);
  uVar8 = local_2f0.exception.ptr.field_1.value.context.ptr.ptr;
  uVar7 = local_2f0.exception.ptr.field_1.value.description.content.size_;
  uVar6 = local_2f0.exception.ptr.field_1.value.description.content.ptr;
  uVar5 = local_2f0.exception.ptr.field_1.value.ownFile.content.size_;
  uVar3 = local_2f0.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_2f0.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_2f0.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.ptr = local_2f0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_188.ownFile.content.size_ = local_2f0.exception.ptr.field_1.value.ownFile.content.size_;
    local_188.ownFile.content.disposer =
         local_2f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2f0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_2f0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_2f0.exception.ptr.field_1.value.file;
    local_188.line = local_2f0.exception.ptr.field_1.value.line;
    local_188.type = local_2f0.exception.ptr.field_1.value.type;
    local_188.description.content.ptr =
         local_2f0.exception.ptr.field_1.value.description.content.ptr;
    local_188.description.content.size_ =
         local_2f0.exception.ptr.field_1.value.description.content.size_;
    local_188.description.content.disposer =
         local_2f0.exception.ptr.field_1.value.description.content.disposer;
    local_2f0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_2f0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_2f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = local_2f0.exception.ptr.field_1.value.context.ptr.ptr;
    local_2f0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_448.ownFile.content.ptr = (char *)uVar3;
    local_448.ownFile.content.size_ = uVar5;
    local_448.ownFile.content.disposer =
         local_2f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_448.file = local_2f0.exception.ptr.field_1.value.file;
    local_448.line = local_2f0.exception.ptr.field_1.value.line;
    local_448.type = local_2f0.exception.ptr.field_1.value.type;
    local_448.description.content.ptr = (char *)uVar6;
    local_448.description.content.size_ = uVar7;
    local_448.description.content.disposer =
         local_2f0.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_448.context.ptr.disposer = local_2f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_448.context.ptr.ptr = (Context *)uVar8;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_448.trace,__src,0x104);
    local_5c0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar3
    ;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar5;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_2f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_448.ownFile.content.ptr = (char *)0x0;
    local_448.ownFile.content.size_ = 0;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_2f0.exception.ptr.field_1.value.file;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_2f0.exception.ptr.field_1._32_8_;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar6;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar7;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_2f0.exception.ptr.field_1.value.description.content.disposer;
    local_448.description.content.ptr = (char *)0x0;
    local_448.description.content.size_ = 0;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_2f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar8;
    local_448.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5c0.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5c0.value.ptr.isSet = false;
    Exception::~Exception(&local_448);
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_5c0)
    ;
    uVar3 = local_5c0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5c0.value.ptr.isSet == true) &&
       (local_5c0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5c0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5c0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5c0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar3)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar3)->_vptr_PromiseNode[-2]));
    }
    if (local_5c0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_188);
  }
  else if (local_190 == '\x01') {
    pHVar1 = (this->func).testCase;
    pAVar2 = ((this->func).pipe)->ends[1].ptr;
    (**(pAVar2->super_AsyncOutputStream)._vptr_AsyncOutputStream)
              (&local_448,&pAVar2->super_AsyncOutputStream,(pHVar1->raw).content.ptr,
               (pHVar1->raw).content.size_ - 1);
    local_5c0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5c0.value.ptr.isSet = true;
    local_5c0.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_448.ownFile.content.ptr;
    local_5c0.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_448.ownFile.content.size_;
    local_448.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_5c0)
    ;
    uVar3 = local_5c0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5c0.value.ptr.isSet == true) &&
       (local_5c0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5c0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5c0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5c0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar3)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar3)->_vptr_PromiseNode[-2]));
    }
    if (local_5c0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    sVar4 = local_448.ownFile.content.size_;
    if ((PromiseNode *)local_448.ownFile.content.size_ != (PromiseNode *)0x0) {
      local_448.ownFile.content.size_ = 0;
      (***(_func_int ***)local_448.ownFile.content.ptr)
                (local_448.ownFile.content.ptr,
                 (_func_int *)((long)(_func_int ***)sVar4 + (long)(*(_func_int ***)sVar4)[-2]));
    }
  }
  if (local_2f0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2f0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }